

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ITxSender_testfile.cpp
# Opt level: O2

ssize_t __thiscall
ITxSender_testfile::send(ITxSender_testfile *this,int __fd,void *__buf,size_t __n,int __flags)

{
  char *pcVar1;
  ssize_t sVar2;
  ostream *poVar3;
  undefined4 in_register_00000034;
  char *pcVar4;
  ofstream *poVar5;
  char *pcVar6;
  
  sVar2 = std::__basic_file<char>::is_open();
  if ((char)sVar2 != '\0') {
    poVar5 = &this->m_file;
    poVar3 = std::operator<<((ostream *)poVar5,"pulse 3400");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"space 1725");
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = (char *)((undefined8 *)CONCAT44(in_register_00000034,__fd))[1];
    for (pcVar6 = *(char **)CONCAT44(in_register_00000034,__fd); pcVar6 != pcVar1;
        pcVar6 = pcVar6 + 1) {
      pcVar4 = "space 1200";
      if (*pcVar6 == '\0') {
        pcVar4 = "space 400";
      }
      poVar3 = std::operator<<((ostream *)poVar5,"pulse 470");
      poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    poVar3 = std::operator<<((ostream *)poVar5,"timeout 13400");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)poVar5,"pulse 3400");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<(poVar3,"space 1725");
    std::endl<char,std::char_traits<char>>(poVar3);
    pcVar1 = *(char **)((long)__buf + 8);
    for (pcVar6 = *__buf; pcVar6 != pcVar1; pcVar6 = pcVar6 + 1) {
      pcVar4 = "space 1200";
      if (*pcVar6 == '\0') {
        pcVar4 = "space 400";
      }
      poVar3 = std::operator<<((ostream *)poVar5,"pulse 470");
      poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
      poVar3 = std::operator<<(poVar3,pcVar4);
      std::endl<char,std::char_traits<char>>(poVar3);
    }
    poVar3 = std::operator<<((ostream *)poVar5,"pulse 470");
    poVar3 = std::endl<char,std::char_traits<char>>(poVar3);
    sVar2 = CONCAT71((int7)((ulong)poVar3 >> 8),(char)sVar2);
  }
  return sVar2;
}

Assistant:

bool ITxSender_testfile::send(const std::vector<uint8_t> &signalHeader
	, const std::vector<uint8_t> &signal)
{
	if (!m_file.is_open()) {
		return false;
	}

	// Start bit.
	m_file << "pulse 3400" << std::endl << "space 1725" << std::endl;

	// Header
	for (auto bit : signalHeader) {
		if (bit) {
			m_file << "pulse 470" << std::endl << "space 1200" << std::endl;
		} else {
			m_file << "pulse 470" << std::endl << "space 400" << std::endl;
		}
	}

	m_file << "timeout 13400" << std::endl;

	// Start bit.
	m_file << "pulse 3400" << std::endl << "space 1725" << std::endl;

	// Message
	for (auto bit : signal) {
		if (bit) {
			m_file << "pulse 470" << std::endl << "space 1200" << std::endl;
		}
		else {
			m_file << "pulse 470" << std::endl << "space 400" << std::endl;
		}
	}

	// End pulse
	m_file << "pulse 470" << std::endl;
	return true;
}